

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  int iVar2;
  MeshType mt;
  DataType DVar3;
  EdgeId EVar4;
  int iVar5;
  int iVar6;
  PtexCache *pPVar7;
  undefined4 extraout_var;
  PtexTexture *pPVar8;
  char *pcVar9;
  ostream *poVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float pixel [3];
  void *data;
  Res res;
  FaceInfo *f;
  int i;
  int nfaces;
  PtexMetaData *meta;
  PtexPtr<Ptex::v2_4::PtexTexture> r;
  PtexPtr<Ptex::v2_4::PtexCache> c;
  String error;
  Res *in_stack_fffffffffffffc20;
  PtexErrorHandler *in_stack_fffffffffffffc30;
  PtexInputHandler *in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  undefined1 premultiply;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  allocator<char> *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  uint in_stack_fffffffffffffc6c;
  void *in_stack_fffffffffffffc70;
  PtexMetaData *in_stack_fffffffffffffd40;
  undefined8 local_e0;
  float local_d8;
  allocator<char> local_d1;
  string local_d0 [34];
  Res local_ae;
  Res local_ab;
  allocator<char> local_a9;
  string local_a8 [36];
  Res local_84;
  Res local_82;
  void *local_80;
  Res local_72;
  FaceInfo *local_70;
  uint local_68;
  int local_64;
  long *local_60;
  undefined4 local_54;
  PtexPtr<Ptex::v2_4::PtexTexture> local_50 [3];
  PtexPtr<Ptex::v2_4::PtexCache> local_38;
  string local_30 [44];
  int local_4;
  
  premultiply = (undefined1)((ulong)in_stack_fffffffffffffc40 >> 0x38);
  local_4 = 0;
  std::__cxx11::string::string(local_30);
  pPVar7 = Ptex::v2_4::PtexCache::create
                     ((int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                      CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                      (bool)premultiply,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexCache>::PtexPtr(&local_38,pPVar7);
  pPVar7 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexCache>::operator->(&local_38);
  (*pPVar7->_vptr_PtexCache[3])(pPVar7,"foo/bar:.");
  pPVar7 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexCache>::operator->(&local_38);
  iVar2 = (*pPVar7->_vptr_PtexCache[5])(pPVar7,"test.ptx",local_30);
  Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::PtexPtr
            (local_50,(PtexTexture *)CONCAT44(extraout_var,iVar2));
  pPVar8 = Ptex::v2_4::PtexPtr::operator_cast_to_PtexTexture_((PtexPtr *)local_50);
  if (pPVar8 == (PtexTexture *)0x0) {
    pcVar9 = (char *)std::__cxx11::string::c_str();
    poVar10 = std::operator<<((ostream *)&std::cerr,pcVar9);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,"meshType: ");
    pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
    mt = (*pPVar8->_vptr_PtexTexture[5])();
    pcVar9 = Ptex::v2_4::MeshTypeName(mt);
    poVar10 = std::operator<<(poVar10,pcVar9);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    poVar10 = std::operator<<((ostream *)&std::cout,"dataType: ");
    pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
    DVar3 = (*pPVar8->_vptr_PtexTexture[6])();
    pcVar9 = Ptex::v2_4::DataTypeName(DVar3);
    poVar10 = std::operator<<(poVar10,pcVar9);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    poVar10 = std::operator<<((ostream *)&std::cout,"numChannels: ");
    pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
    iVar2 = (*pPVar8->_vptr_PtexTexture[0xb])();
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"alphaChannel: ");
    pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
    iVar2 = (*pPVar8->_vptr_PtexTexture[10])();
    if (iVar2 == -1) {
      poVar10 = std::operator<<((ostream *)&std::cout,"(none)");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    else {
      pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      iVar2 = (*pPVar8->_vptr_PtexTexture[10])();
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    poVar10 = std::operator<<((ostream *)&std::cout,"numFaces: ");
    pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
    iVar2 = (*pPVar8->_vptr_PtexTexture[0xc])();
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
    iVar2 = (*pPVar8->_vptr_PtexTexture[0xf])();
    local_60 = (long *)CONCAT44(extraout_var_00,iVar2);
    poVar10 = std::operator<<((ostream *)&std::cout,"numMetaKeys: ");
    iVar2 = (**(code **)(*local_60 + 0x18))();
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    iVar2 = (**(code **)(*local_60 + 0x18))();
    if (iVar2 != 0) {
      DumpMetaData(in_stack_fffffffffffffd40);
    }
    (**(code **)(*local_60 + 0x10))();
    pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
    local_64 = (*pPVar8->_vptr_PtexTexture[0xc])();
    for (local_68 = 0; (int)local_68 < local_64; local_68 = local_68 + 1) {
      pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      iVar2 = (*pPVar8->_vptr_PtexTexture[0x10])(pPVar8,(ulong)local_68);
      local_70 = (FaceInfo *)CONCAT44(extraout_var_01,iVar2);
      poVar10 = std::operator<<((ostream *)&std::cout,"face ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_68);
      poVar10 = std::operator<<(poVar10,":\n");
      poVar10 = std::operator<<(poVar10,"  res: ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)(local_70->res).ulog2);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)(local_70->res).vlog2);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"  adjface: ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_70->adjfaces[0]);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_70->adjfaces[1]);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_70->adjfaces[2]);
      poVar10 = std::operator<<(poVar10,' ');
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_70->adjfaces[3]);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"  adjedge: ");
      EVar4 = Ptex::v2_4::FaceInfo::adjedge(local_70,0);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,EVar4);
      poVar10 = std::operator<<(poVar10,' ');
      EVar4 = Ptex::v2_4::FaceInfo::adjedge(local_70,1);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,EVar4);
      poVar10 = std::operator<<(poVar10,' ');
      EVar4 = Ptex::v2_4::FaceInfo::adjedge(local_70,2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,EVar4);
      poVar10 = std::operator<<(poVar10,' ');
      EVar4 = Ptex::v2_4::FaceInfo::adjedge(local_70,3);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,EVar4);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"  flags: ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)local_70->flags);
      std::operator<<(poVar10,"\n");
      local_72 = local_70->res;
      pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      DVar3 = (*pPVar8->_vptr_PtexTexture[6])();
      iVar2 = Ptex::v2_4::DataSize(DVar3);
      pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      iVar5 = (*pPVar8->_vptr_PtexTexture[0xb])();
      iVar6 = Ptex::v2_4::Res::size(in_stack_fffffffffffffc20);
      local_80 = malloc((long)(iVar2 * iVar5 * iVar6));
      while( true ) {
        bVar1 = true;
        if (local_72.ulog2 < '\x01') {
          bVar1 = '\0' < local_72.vlog2;
        }
        if (!bVar1) break;
        pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
        local_82 = local_72;
        (*pPVar8->_vptr_PtexTexture[0x12])
                  (pPVar8,(ulong)local_68,local_80,0,(ulong)(ushort)local_72);
        local_84 = local_72;
        pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
        (*pPVar8->_vptr_PtexTexture[6])();
        pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
        (*pPVar8->_vptr_PtexTexture[0xb])();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,
                   (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                   in_stack_fffffffffffffc50);
        DumpData(SUB82((ulong)in_stack_fffffffffffffc70 >> 0x30,0),
                 (DataType)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                 in_stack_fffffffffffffc60,
                 (string *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator(&local_a9);
        if (local_72.ulog2 != '\0') {
          local_72.ulog2 = local_72.ulog2 + -1;
        }
        if (local_72.vlog2 != '\0') {
          local_72.vlog2 = local_72.vlog2 + -1;
        }
      }
      pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      in_stack_fffffffffffffc6c = local_68;
      in_stack_fffffffffffffc70 = local_80;
      Ptex::v2_4::Res::Res(&local_ab,'\0','\0');
      (*pPVar8->_vptr_PtexTexture[0x12])
                (pPVar8,(ulong)in_stack_fffffffffffffc6c,in_stack_fffffffffffffc70,0,
                 (ulong)(ushort)local_ab);
      local_ae = local_72;
      in_stack_fffffffffffffc60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      in_stack_fffffffffffffc5c = (*(*(_func_int ***)in_stack_fffffffffffffc60)[6])();
      in_stack_fffffffffffffc50 =
           (allocator<char> *)Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      (*(*(_func_int ***)in_stack_fffffffffffffc50)[0xb])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,
                 (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 in_stack_fffffffffffffc50);
      DumpData(SUB82((ulong)in_stack_fffffffffffffc70 >> 0x30,0),(DataType)in_stack_fffffffffffffc70
               ,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc60,
               (string *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator(&local_d1);
      free(local_80);
      local_e0 = 0xbf800000bf800000;
      local_d8 = -1.0;
      pPVar8 = Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::operator->(local_50);
      (*pPVar8->_vptr_PtexTexture[0x15])(pPVar8,(ulong)local_68,1,1,&local_e0,3,3);
      if (((float)local_e0 != 0.0) || (NAN((float)local_e0))) {
LAB_00106d1a:
        poVar10 = std::operator<<((ostream *)&std::cerr,"pixel should be zero");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        goto LAB_00106dd3;
      }
      if ((local_e0._4_4_ != 0.0) ||
         (((NAN(local_e0._4_4_) || (local_d8 != 0.0)) || (NAN(local_d8))))) goto LAB_00106d1a;
    }
    local_4 = 0;
  }
LAB_00106dd3:
  local_54 = 1;
  Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexTexture>::~PtexPtr
            ((PtexPtr<Ptex::v2_4::PtexTexture> *)in_stack_fffffffffffffc20);
  Ptex::v2_4::PtexPtr<Ptex::v2_4::PtexCache>::~PtexPtr
            ((PtexPtr<Ptex::v2_4::PtexCache> *)in_stack_fffffffffffffc20);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
    Ptex::String error;
    PtexPtr<PtexCache> c(PtexCache::create(0,0));
    c->setSearchPath("foo/bar:.");
    PtexPtr<PtexTexture> r(c->get("test.ptx", error));

    if (!r) {
        std::cerr << error.c_str() << std::endl;
        return 1;
    }
    std::cout << "meshType: " << Ptex::MeshTypeName(r->meshType()) << std::endl;
    std::cout << "dataType: " << Ptex::DataTypeName(r->dataType()) << std::endl;
    std::cout << "numChannels: " << r->numChannels() << std::endl;
    std::cout << "alphaChannel: ";
    if (r->alphaChannel() == -1) std::cout << "(none)" << std::endl;
    else std::cout << r->alphaChannel() << std::endl;
    std::cout << "numFaces: " << r->numFaces() << std::endl;

    PtexMetaData* meta = r->getMetaData();
    std::cout << "numMetaKeys: " << meta->numKeys() << std::endl;
    if (meta->numKeys()) DumpMetaData(meta);
    meta->release();

    int nfaces = r->numFaces();
    for (int i = 0; i < nfaces; i++) {
        const Ptex::FaceInfo& f = r->getFaceInfo(i);
        std::cout << "face " << i << ":\n"
                  << "  res: " << int(f.res.ulog2) << ' ' << int(f.res.vlog2) << "\n"
                  << "  adjface: " 
                  << f.adjfaces[0] << ' '
                  << f.adjfaces[1] << ' '
                  << f.adjfaces[2] << ' '
                  << f.adjfaces[3] << "\n"
                  << "  adjedge: " 
                  << f.adjedge(0) << ' '
                  << f.adjedge(1) << ' '
                  << f.adjedge(2) << ' '
                  << f.adjedge(3) << "\n"
                  << "  flags: " << int(f.flags) << "\n";

        Ptex::Res res = f.res;
        void* data = malloc(Ptex::DataSize(r->dataType()) * r->numChannels() * res.size());
        while (res.ulog2 > 0 || res.vlog2 > 0) {
            r->getData(i, data, 0, res);
            DumpData(res, r->dataType(), r->numChannels(), data, "  ");
            if (res.ulog2) res.ulog2--;
            if (res.vlog2) res.vlog2--;
        }
        r->getData(i, data, 0, Ptex::Res(0,0));
        DumpData(res, r->dataType(), r->numChannels(), data, "  ");
        free(data);

        // Read more channels than are available.
        // This should wipe pixel with zeroes and nothing more.
        float pixel[] = {-1.0f, -1.0f, -1.0f};
        r->getPixel(i, 1, 1, pixel, 3, 3);
        if (pixel[0] != 0.0f || pixel[1] != 0.0f || pixel[2] != 0.0f) {
                std::cerr << "pixel should be zero" << std::endl;
                return 1;
        }
    }

    return 0;
}